

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRead.c
# Opt level: O1

int Cudd_bddRead(FILE *fp,DdManager *dd,DdNode **E,DdNode ***x,DdNode ***y,int *nx,int *ny,int *m,
                int *n,int bx,int sx,int by,int sy)

{
  int *piVar1;
  DdNode *T;
  bool bVar2;
  int iVar3;
  uint uVar4;
  DdNode **ppDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  uint *puVar11;
  DdNode *pDVar12;
  FILE *pFVar13;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint *local_60;
  ulong local_58;
  DdNode **local_50;
  FILE *local_48;
  DdNode **local_40;
  DdNode **local_38;
  
  T = dd->one;
  local_60 = (uint *)nx;
  local_48 = (FILE *)fp;
  iVar3 = __isoc99_fscanf(fp,"%d %d",&local_6c);
  if (iVar3 != 2) {
    return 0;
  }
  *m = local_6c;
  ppDVar5 = *x;
  uVar4 = local_6c - 1;
  local_68 = 0;
  bVar2 = 1 < (int)local_6c;
  local_6c = uVar4;
  if (bVar2) {
    local_68 = 0;
    do {
      local_6c = uVar4 >> 1;
      local_68 = local_68 + 1;
      bVar2 = 1 < uVar4;
      uVar4 = local_6c;
    } while (bVar2);
  }
  if ((int)*local_60 < (int)local_68) {
    if (ppDVar5 == (DdNode **)0x0) {
      ppDVar5 = (DdNode **)malloc((ulong)local_68 << 3);
    }
    else {
      ppDVar5 = (DdNode **)realloc(ppDVar5,(ulong)local_68 << 3);
    }
    *x = ppDVar5;
    if (ppDVar5 != (DdNode **)0x0) goto LAB_0078b399;
LAB_0078b704:
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_0078b71b:
    iVar8 = 0;
  }
  else {
LAB_0078b399:
    *n = local_70;
    local_38 = *y;
    uVar4 = local_70 - 1;
    uVar9 = 0;
    bVar2 = 1 < (int)local_70;
    local_70 = uVar4;
    if (bVar2) {
      uVar9 = 0;
      do {
        local_70 = uVar4 >> 1;
        uVar9 = uVar9 + 1;
        bVar2 = 1 < uVar4;
        uVar4 = local_70;
      } while (bVar2);
    }
    if (*ny < (int)uVar9) {
      if (local_38 == (DdNode **)0x0) {
        local_38 = (DdNode **)malloc((ulong)uVar9 << 3);
      }
      else {
        local_38 = (DdNode **)realloc(local_38,(ulong)uVar9 << 3);
      }
      *y = local_38;
      if (local_38 == (DdNode **)0x0) goto LAB_0078b704;
    }
    pDVar12 = (DdNode *)((ulong)T ^ 1);
    uVar4 = *local_60;
    lVar10 = (long)(int)uVar4;
    local_64 = uVar9;
    local_50 = E;
    local_40 = ppDVar5;
    if ((int)uVar4 < (int)local_68) {
      iVar3 = uVar4 * sx + bx;
      local_58 = (ulong)(int)local_68;
      do {
        do {
          dd->reordered = 0;
          pDVar6 = cuddUniqueInter(dd,iVar3,T,pDVar12);
          ppDVar5[lVar10] = pDVar6;
        } while (dd->reordered == 1);
        if (pDVar6 == (DdNode *)0x0) goto LAB_0078b71b;
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        lVar10 = lVar10 + 1;
        iVar3 = iVar3 + sx;
      } while (lVar10 != local_58);
    }
    iVar3 = *ny;
    lVar10 = (long)iVar3;
    if (iVar3 < (int)local_64) {
      iVar3 = iVar3 * sy + by;
      local_58 = (ulong)(int)local_64;
      do {
        do {
          dd->reordered = 0;
          pDVar6 = cuddUniqueInter(dd,iVar3,T,pDVar12);
          local_38[lVar10] = pDVar6;
        } while (dd->reordered == 1);
        if (pDVar6 == (DdNode *)0x0) goto LAB_0078b71b;
        piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        lVar10 = lVar10 + 1;
        iVar3 = iVar3 + sy;
      } while (lVar10 != local_58);
    }
    pFVar13 = local_48;
    uVar9 = local_64;
    uVar4 = local_68;
    *local_60 = local_68;
    *ny = local_64;
    *local_50 = pDVar12;
    piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    iVar3 = feof(local_48);
    iVar8 = 1;
    if (iVar3 == 0) {
      local_60 = (uint *)((ulong)uVar9 + 1);
      local_58 = (ulong)T & 0xfffffffffffffffe;
      do {
        iVar3 = __isoc99_fscanf(pFVar13,"%d %d",&local_6c,&local_70);
        if (iVar3 != 2) {
          if (iVar3 == -1) {
            return 1;
          }
          goto LAB_0078b71b;
        }
        if (((*m <= (int)local_6c) || (*n <= (int)local_70)) || ((int)(local_70 | local_6c) < 0))
        goto LAB_0078b71b;
        *(int *)(local_58 + 4) = *(int *)(local_58 + 4) + 1;
        lVar10 = (ulong)uVar4 + 1;
        pDVar12 = T;
        pDVar6 = T;
        if (0 < (int)local_68) {
          do {
            pDVar6 = (DdNode *)((ulong)local_40[lVar10 + -2] ^ 1);
            if ((local_6c & 1) != 0) {
              pDVar6 = local_40[lVar10 + -2];
            }
            pDVar6 = Cudd_bddAnd(dd,pDVar12,pDVar6);
            if (pDVar6 == (DdNode *)0x0) goto LAB_0078b710;
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,pDVar12);
            local_6c = (int)local_6c >> 1;
            lVar10 = lVar10 + -1;
            pDVar12 = pDVar6;
          } while (1 < lVar10);
        }
        puVar11 = local_60;
        pDVar12 = pDVar6;
        if (0 < (int)local_64) {
          do {
            pDVar6 = (DdNode *)((ulong)local_38[(long)puVar11 + -2] ^ 1);
            if ((local_70 & 1) != 0) {
              pDVar6 = local_38[(long)puVar11 + -2];
            }
            pDVar6 = Cudd_bddAnd(dd,pDVar12,pDVar6);
            if (pDVar6 == (DdNode *)0x0) goto LAB_0078b710;
            piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDeref(dd,pDVar12);
            local_70 = (int)local_70 >> 1;
            puVar11 = (uint *)((long)puVar11 + -1);
            pDVar12 = pDVar6;
          } while (1 < (long)puVar11);
        }
        ppDVar5 = local_50;
        pDVar7 = Cudd_bddAnd(dd,(DdNode *)((ulong)pDVar6 ^ 1),(DdNode *)((ulong)*local_50 ^ 1));
        pDVar12 = pDVar6;
        if (pDVar7 == (DdNode *)0x0) {
LAB_0078b710:
          Cudd_RecursiveDeref(dd,pDVar12);
          goto LAB_0078b71b;
        }
        piVar1 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar6);
        Cudd_RecursiveDeref(dd,*ppDVar5);
        pFVar13 = local_48;
        *ppDVar5 = (DdNode *)((ulong)pDVar7 ^ 1);
        iVar3 = feof(local_48);
      } while (iVar3 == 0);
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

int
Cudd_bddRead(
  FILE * fp /* input file pointer */,
  DdManager * dd /* DD manager */,
  DdNode ** E /* characteristic function of the graph */,
  DdNode *** x /* array of row variables */,
  DdNode *** y /* array of column variables */,
  int * nx /* number or row variables */,
  int * ny /* number or column variables */,
  int * m /* number of rows */,
  int * n /* number of columns */,
  int  bx /* first index of row variables */,
  int  sx /* step of row variables */,
  int  by /* first index of column variables */,
  int  sy /* step of column variables */)
{
    DdNode *one, *zero;
    DdNode *w;
    DdNode *minterm1;
    int u, v, err, i, nv;
    int lnx, lny;
    DdNode **lx, **ly;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    err = fscanf(fp, "%d %d", &u, &v);
    if (err == EOF) {
        return(0);
    } else if (err != 2) {
        return(0);
    }

    *m = u;
    /* Compute the number of x variables. */
    lx = *x;
    u--;        /* row and column numbers start from 0 */
    for (lnx=0; u > 0; lnx++) {
        u >>= 1;
    }
    if (lnx > *nx) {
        *x = lx = ABC_REALLOC(DdNode *, *x, lnx);
        if (lx == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    *n = v;
    /* Compute the number of y variables. */
    ly = *y;
    v--;        /* row and column numbers start from 0 */
    for (lny=0; v > 0; lny++) {
        v >>= 1;
    }
    if (lny > *ny) {
        *y = ly = ABC_REALLOC(DdNode *, *y, lny);
        if (ly == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
    }

    /* Create all new variables. */
    for (i = *nx, nv = bx + (*nx) * sx; i < lnx; i++, nv += sx) {
        do {
            dd->reordered = 0;
            lx[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (lx[i] == NULL) return(0);
        cuddRef(lx[i]);
    }
    for (i = *ny, nv = by + (*ny) * sy; i < lny; i++, nv += sy) {
        do {
            dd->reordered = 0;
            ly[i] = cuddUniqueInter(dd, nv, one, zero);
        } while (dd->reordered == 1);
        if (ly[i] == NULL) return(0);
        cuddRef(ly[i]);
    }
    *nx = lnx;
    *ny = lny;

    *E = zero; /* this call will never cause reordering */
    cuddRef(*E);

    while (! feof(fp)) {
        err = fscanf(fp, "%d %d", &u, &v);
        if (err == EOF) {
            break;
        } else if (err != 2) {
            return(0);
        } else if (u >= *m || v >= *n || u < 0 || v < 0) {
            return(0);
        }
 
        minterm1 = one; cuddRef(minterm1);

        /* Build minterm1 corresponding to this arc. */
        for (i = lnx - 1; i>=0; i--) {
            if (u & 1) {
                w = Cudd_bddAnd(dd, minterm1, lx[i]);
            } else {
                w = Cudd_bddAnd(dd, minterm1, Cudd_Not(lx[i]));
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd,minterm1);
            minterm1 = w;
            u >>= 1;
        }
        for (i = lny - 1; i>=0; i--) {
            if (v & 1) {
                w = Cudd_bddAnd(dd, minterm1, ly[i]);
            } else {
                w = Cudd_bddAnd(dd, minterm1, Cudd_Not(ly[i]));
            }
            if (w == NULL) {
                Cudd_RecursiveDeref(dd, minterm1);
                return(0);
            }
            cuddRef(w);
            Cudd_RecursiveDeref(dd, minterm1);
            minterm1 = w;
            v >>= 1;
        }

        w = Cudd_bddAnd(dd, Cudd_Not(minterm1), Cudd_Not(*E));
        if (w == NULL) {
            Cudd_RecursiveDeref(dd, minterm1);
            return(0);
        }
        w = Cudd_Not(w);
        cuddRef(w);
        Cudd_RecursiveDeref(dd, minterm1);
        Cudd_RecursiveDeref(dd, *E);
        *E = w;
    }
    return(1);

}